

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

xmlChar * xmlTextWriterVSprintf(char *format,__va_list_tag *argptr)

{
  uint uVar1;
  xmlChar *__s;
  size_t __maxlen;
  va_list locarg;
  
  __maxlen = 0x2000;
  __s = (xmlChar *)(*xmlMalloc)(0x2000);
  while( true ) {
    if (__s == (xmlChar *)0x0) {
      xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_NO_MEMORY,
                      "xmlTextWriterVSprintf : out of memory!\n");
      return (xmlChar *)0x0;
    }
    locarg[0].reg_save_area = argptr->reg_save_area;
    locarg[0].gp_offset = argptr->gp_offset;
    locarg[0].fp_offset = argptr->fp_offset;
    locarg[0].overflow_arg_area = argptr->overflow_arg_area;
    uVar1 = vsnprintf((char *)__s,__maxlen,format,locarg);
    if ((((long)(int)uVar1 < (long)__maxlen) && (-1 < (int)uVar1)) && (__maxlen - 1 != (ulong)uVar1)
       ) break;
    (*xmlFree)(__s);
    __maxlen = __maxlen + 0x2000;
    __s = (xmlChar *)(*xmlMalloc)(__maxlen);
  }
  return __s;
}

Assistant:

static xmlChar *
xmlTextWriterVSprintf(const char *format, va_list argptr)
{
    int size;
    int count;
    xmlChar *buf;
    va_list locarg;

    size = BUFSIZ;
    buf = (xmlChar *) xmlMalloc(size);
    if (buf == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlTextWriterVSprintf : out of memory!\n");
        return NULL;
    }

    va_copy(locarg, argptr);
    while (((count = vsnprintf((char *) buf, size, format, locarg)) < 0)
           || (count == size - 1) || (count == size) || (count > size)) {
	va_end(locarg);
        xmlFree(buf);
        size += BUFSIZ;
        buf = (xmlChar *) xmlMalloc(size);
        if (buf == NULL) {
            xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                            "xmlTextWriterVSprintf : out of memory!\n");
            return NULL;
        }
	va_copy(locarg, argptr);
    }
    va_end(locarg);

    return buf;
}